

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::IsDiagonal(Matrix *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int column;
  long lVar7;
  Fraction local_38;
  
  lVar6 = 0;
  lVar4 = 0;
  while( true ) {
    iVar1 = this->n_;
    if (iVar1 <= lVar4) break;
    lVar5 = 0;
    for (lVar7 = 0; lVar7 < this->m_; lVar7 = lVar7 + 1) {
      if (lVar6 != lVar5) {
        lVar2 = *(long *)&(this->elements_).
                          super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar4].
                          super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                          super__Vector_impl_data;
        Fraction::Fraction(&local_38,0);
        bVar3 = operator!=((Fraction *)(lVar2 + lVar5),&local_38);
        if (bVar3) goto LAB_00109af7;
      }
      lVar5 = lVar5 + 8;
    }
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 8;
  }
LAB_00109af7:
  return iVar1 <= lVar4;
}

Assistant:

bool Matrix::IsDiagonal() const {
  for (int row = 0; row < n_; ++row) {
    for (int column = 0; column < m_; ++column) {
      if (row != column && elements_[row][column] != 0) {
        return false;
      }
    }
  }

  return true;
}